

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O0

INT Silent_AddPaddingVfprintf(PAL_FILE *stream,LPSTR In,INT Padding,INT Flags)

{
  int iVar1;
  errno_t eVar2;
  size_t sVar3;
  char *_Dst;
  size_t sVar4;
  INT local_44;
  int iLen;
  INT Written;
  LPSTR OutOriginal;
  INT Length;
  INT LengthInStr;
  LPSTR Out;
  INT Flags_local;
  INT Padding_local;
  LPSTR In_local;
  PAL_FILE *stream_local;
  
  sVar3 = strlen(In);
  iVar1 = (int)sVar3;
  OutOriginal._0_4_ = iVar1;
  if (0 < Padding) {
    OutOriginal._0_4_ = Padding + iVar1;
  }
  _Dst = (char *)PAL_malloc((long)((int)OutOriginal + 1));
  if (_Dst == (char *)0x0) {
    return -1;
  }
  _Length = _Dst;
  if ((Flags & 1U) != 0) {
    eVar2 = strcpy_s(_Dst,(long)((int)OutOriginal + 1),In);
    if (eVar2 != 0) {
      local_44 = -1;
      goto LAB_00174fab;
    }
    _Length = _Dst + iVar1;
  }
  if (0 < Padding) {
    Out._4_4_ = Padding;
    if ((Flags & 4U) == 0) {
      while (Out._4_4_ != 0) {
        *_Length = ' ';
        _Length = _Length + 1;
        Out._4_4_ = Out._4_4_ + -1;
      }
    }
    else {
      while (Out._4_4_ != 0) {
        *_Length = '0';
        _Length = _Length + 1;
        Out._4_4_ = Out._4_4_ + -1;
      }
    }
  }
  if (((Flags & 1U) == 0) && (eVar2 = strcpy_s(_Length,(long)((int)OutOriginal + 1),In), eVar2 != 0)
     ) {
    local_44 = -1;
  }
  else {
    sVar4 = PAL_fwrite(_Dst,1,(long)(int)OutOriginal,stream);
    local_44 = (INT)sVar4;
    if (stream->PALferrorCode == 1) {
      local_44 = -1;
    }
  }
LAB_00174fab:
  PAL_free(_Dst);
  return local_44;
}

Assistant:

INT Silent_AddPaddingVfprintf(PAL_FILE *stream, LPSTR In, INT Padding, INT Flags)
{
    LPSTR Out;
    INT LengthInStr;
    INT Length;
    LPSTR OutOriginal;
    INT Written;

    LengthInStr = strlen(In);
    Length = LengthInStr;


    if (Padding > 0)
    {
        Length += Padding;
    }
    Out = (LPSTR) PAL_malloc(Length+1);
    int iLen = Length+1;
    if (!Out)
    {
        return -1;
    }
    OutOriginal = Out;

    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (strcpy_s(Out, iLen, In) != SAFECRT_SUCCESS)
        {
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLen -= LengthInStr;
    }
    if (Padding > 0)
    {
        iLen -= Padding;
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding--)
            {
                *Out++ = '0';
            }
        }
        else /* pad with spaces */
        {
            while (Padding--)
            {
                *Out++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (strcpy_s(Out, Length+1, In) != SAFECRT_SUCCESS)
        {
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLen -= LengthInStr;
    }

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr((FILE*)stream);
#endif

    Written = PAL_fwrite(OutOriginal, 1, Length, stream);
    if (stream->PALferrorCode == PAL_FILE_ERROR)
    {
        Written = -1;
    }

Done:
    PAL_free(OutOriginal);
    return Written;
}